

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmLocalCommonGenerator.cxx
# Opt level: O1

void __thiscall cmLocalCommonGenerator::~cmLocalCommonGenerator(cmLocalCommonGenerator *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pcVar2;
  
  (this->super_cmLocalGenerator)._vptr_cmLocalGenerator =
       (_func_int **)&PTR__cmLocalCommonGenerator_005d8e10;
  pcVar2 = (this->ConfigName)._M_dataplus._M_p;
  paVar1 = &(this->ConfigName).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar2 != paVar1) {
    operator_delete(pcVar2,paVar1->_M_allocated_capacity + 1);
  }
  pcVar2 = (this->WorkingDirectory)._M_dataplus._M_p;
  paVar1 = &(this->WorkingDirectory).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar2 != paVar1) {
    operator_delete(pcVar2,paVar1->_M_allocated_capacity + 1);
  }
  cmLocalGenerator::~cmLocalGenerator(&this->super_cmLocalGenerator);
  return;
}

Assistant:

cmLocalCommonGenerator::~cmLocalCommonGenerator() = default;